

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseFailureIncludesCheckExpectedAndActual::
~TestCheckCloseFailureIncludesCheckExpectedAndActual
          (TestCheckCloseFailureIncludesCheckExpectedAndActual *this)

{
  TestCheckCloseFailureIncludesCheckExpectedAndActual *this_local;
  
  ~TestCheckCloseFailureIncludesCheckExpectedAndActual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    const float expected = 0.9f;
    const float actual = 1.1f;
    CheckClose(results, expected, actual, 0.01f, TestDetails("", "", "", 0));

	using namespace std;
    CHECK(strstr(reporter.lastFailedMessage, "xpected 0.9"));
    CHECK(strstr(reporter.lastFailedMessage, "was 1.1"));
}